

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  float fVar1;
  ImWchar IVar2;
  uint i_00;
  ImFontGlyph *pIVar3;
  float *pfVar4;
  unsigned_short *puVar5;
  ImFontGlyph *__src;
  int iVar6;
  int local_44;
  ImWchar IStack_3e;
  int i_2;
  ImWchar IStack_38;
  ImWchar fallback_chars [3];
  ImWchar dots_chars [2];
  ImWchar ellipsis_chars [2];
  ImFontGlyph *tab_glyph;
  int page_n;
  int codepoint;
  int i_1;
  int i;
  int max_codepoint;
  ImFont *this_local;
  
  i_1 = 0;
  for (codepoint = 0; codepoint != (this->Glyphs).Size; codepoint = codepoint + 1) {
    pIVar3 = ImVector<ImFontGlyph>::operator[](&this->Glyphs,codepoint);
    i_1 = ImMax<int>(i_1,*(uint *)pIVar3 >> 2);
  }
  if (0xfffe < (this->Glyphs).Size) {
    __assert_fail("Glyphs.Size < 0xFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui_draw.cpp"
                  ,0xc5d,"void ImFont::BuildLookupTable()");
  }
  ImVector<float>::clear(&this->IndexAdvanceX);
  ImVector<unsigned_short>::clear(&this->IndexLookup);
  this->DirtyLookupTables = false;
  memset(this->Used4kPagesMap,0,2);
  GrowIndex(this,i_1 + 1);
  for (page_n = 0; page_n < (this->Glyphs).Size; page_n = page_n + 1) {
    pIVar3 = ImVector<ImFontGlyph>::operator[](&this->Glyphs,page_n);
    i_00 = *(uint *)pIVar3 >> 2;
    pIVar3 = ImVector<ImFontGlyph>::operator[](&this->Glyphs,page_n);
    fVar1 = pIVar3->AdvanceX;
    pfVar4 = ImVector<float>::operator[](&this->IndexAdvanceX,i_00);
    *pfVar4 = fVar1;
    puVar5 = ImVector<unsigned_short>::operator[](&this->IndexLookup,i_00);
    *puVar5 = (unsigned_short)page_n;
    iVar6 = (int)(i_00 / 0x1000) >> 3;
    this->Used4kPagesMap[iVar6] =
         this->Used4kPagesMap[iVar6] | (byte)(1 << ((byte)(i_00 / 0x1000) & 7));
  }
  pIVar3 = FindGlyph(this,0x20);
  if (pIVar3 != (ImFontGlyph *)0x0) {
    pIVar3 = ImVector<ImFontGlyph>::back(&this->Glyphs);
    if (*(uint *)pIVar3 >> 2 != 9) {
      ImVector<ImFontGlyph>::resize(&this->Glyphs,(this->Glyphs).Size + 1);
    }
    pIVar3 = ImVector<ImFontGlyph>::back(&this->Glyphs);
    __src = FindGlyph(this,0x20);
    memcpy(pIVar3,__src,0x28);
    *(uint *)pIVar3 = *(uint *)pIVar3 & 3 | 0x24;
    pIVar3->AdvanceX = pIVar3->AdvanceX * 4.0;
    fVar1 = pIVar3->AdvanceX;
    pfVar4 = ImVector<float>::operator[](&this->IndexAdvanceX,*(uint *)pIVar3 >> 2);
    *pfVar4 = fVar1;
    iVar6 = (this->Glyphs).Size;
    puVar5 = ImVector<unsigned_short>::operator[](&this->IndexLookup,*(uint *)pIVar3 >> 2);
    *puVar5 = (short)iVar6 - 1;
  }
  SetGlyphVisible(this,0x20,false);
  SetGlyphVisible(this,9,false);
  fallback_chars[1] = 0x2026;
  fallback_chars[2] = 0x85;
  _IStack_38 = 0xff0e002e;
  if (this->EllipsisChar == 0xffff) {
    IVar2 = FindFirstExistingGlyph(this,fallback_chars + 1,2);
    this->EllipsisChar = IVar2;
  }
  if (this->DotChar == 0xffff) {
    IVar2 = FindFirstExistingGlyph(this,&IStack_38,2);
    this->DotChar = IVar2;
  }
  _IStack_3e = 0x3ffffd;
  i_2._2_2_ = 0x20;
  pIVar3 = FindGlyphNoFallback(this,this->FallbackChar);
  this->FallbackGlyph = pIVar3;
  if (this->FallbackGlyph == (ImFontGlyph *)0x0) {
    IVar2 = FindFirstExistingGlyph(this,&IStack_3e,3);
    this->FallbackChar = IVar2;
    pIVar3 = FindGlyphNoFallback(this,this->FallbackChar);
    this->FallbackGlyph = pIVar3;
    if (this->FallbackGlyph == (ImFontGlyph *)0x0) {
      pIVar3 = ImVector<ImFontGlyph>::back(&this->Glyphs);
      this->FallbackGlyph = pIVar3;
      this->FallbackChar = (ImWchar)(*(uint *)this->FallbackGlyph >> 2);
    }
  }
  this->FallbackAdvanceX = this->FallbackGlyph->AdvanceX;
  for (local_44 = 0; local_44 < i_1 + 1; local_44 = local_44 + 1) {
    pfVar4 = ImVector<float>::operator[](&this->IndexAdvanceX,local_44);
    if (*pfVar4 <= 0.0 && *pfVar4 != 0.0) {
      fVar1 = this->FallbackAdvanceX;
      pfVar4 = ImVector<float>::operator[](&this->IndexAdvanceX,local_44);
      *pfVar4 = fVar1;
    }
  }
  return;
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size - 1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Note that 0x2026 is rarely included in our font ranges. Because of this we are more likely to use three individual dots.
    const ImWchar ellipsis_chars[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
    const ImWchar dots_chars[] = { (ImWchar)'.', (ImWchar)0xFF0E };
    if (EllipsisChar == (ImWchar)-1)
        EllipsisChar = FindFirstExistingGlyph(this, ellipsis_chars, IM_ARRAYSIZE(ellipsis_chars));
    if (DotChar == (ImWchar)-1)
        DotChar = FindFirstExistingGlyph(this, dots_chars, IM_ARRAYSIZE(dots_chars));

    // Setup fallback character
    const ImWchar fallback_chars[] = { (ImWchar)IM_UNICODE_CODEPOINT_INVALID, (ImWchar)'?', (ImWchar)' ' };
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    if (FallbackGlyph == NULL)
    {
        FallbackChar = FindFirstExistingGlyph(this, fallback_chars, IM_ARRAYSIZE(fallback_chars));
        FallbackGlyph = FindGlyphNoFallback(FallbackChar);
        if (FallbackGlyph == NULL)
        {
            FallbackGlyph = &Glyphs.back();
            FallbackChar = (ImWchar)FallbackGlyph->Codepoint;
        }
    }

    FallbackAdvanceX = FallbackGlyph->AdvanceX;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}